

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotefile.c
# Opt level: O0

apx_size_t rmf_address_encode(uint8_t *buf,apx_size_t buf_size,uint32_t address,_Bool more_bit)

{
  ushort uVar1;
  uint uVar2;
  uint32_t value_1;
  uint16_t value;
  apx_size_t encoding_size;
  _Bool more_bit_local;
  uint32_t address_local;
  apx_size_t buf_size_local;
  uint8_t *buf_local;
  
  if (((buf == (uint8_t *)0x0) || (buf_size == 0)) || (0x3fffffff < address)) {
    buf_local._4_4_ = 0;
  }
  else {
    buf_local._4_4_ = rmf_needed_encoding_size(address);
    if (buf_size < buf_local._4_4_) {
      buf_local._4_4_ = 0;
    }
    else if (buf_local._4_4_ == 2) {
      uVar1 = 0;
      if (more_bit) {
        uVar1 = 0x4000;
      }
      packBE(buf,(uint)(ushort)(uVar1 | (ushort)address),'\x02');
    }
    else {
      if (buf_local._4_4_ != 4) {
        __assert_fail("encoding_size == UINT32_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/remotefile.c"
                      ,0x50,"apx_size_t rmf_address_encode(uint8_t *, apx_size_t, uint32_t, _Bool)")
        ;
      }
      uVar2 = 0x80000000;
      if (more_bit) {
        uVar2 = 0xc0000000;
      }
      packBE(buf,address | uVar2,'\x04');
    }
  }
  return buf_local._4_4_;
}

Assistant:

apx_size_t rmf_address_encode(uint8_t* buf, apx_size_t buf_size, uint32_t address, bool more_bit)
{
   if ((buf == NULL) || (buf_size == 0) || (address > RMF_HIGH_ADDR_MAX))
   {
      return 0; //Invalid argument
   }
   apx_size_t encoding_size = rmf_needed_encoding_size(address);
   if (encoding_size <= buf_size)
   {
      if (encoding_size == UINT16_SIZE)
      {
         uint16_t value = more_bit ? RMF_MORE_BIT_LOW_ADDR : 0u;
         value |= (uint16_t)address;
         packBE(buf, (uint32_t)value, (uint8_t) UINT16_SIZE);
      }
      else
      {
         assert(encoding_size == UINT32_SIZE);
         uint32_t value = more_bit ? (RMF_HIGH_ADDR_BIT | RMF_MORE_BIT_HIGH_ADDR) : RMF_HIGH_ADDR_BIT;
         value |= address;
         packBE(buf, value, (uint8_t)UINT32_SIZE);
      }
   }
   else
   {
      return 0u; //Not enough bytes in buffer
   }
   return encoding_size;
}